

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  Expr *pEVar1;
  ModuleField *pMVar2;
  ModuleField *pMVar3;
  _Head_base<0UL,_wabt::Import_*,_false> _Var4;
  DataSegmentModuleField *pDVar5;
  bool bVar6;
  Result RVar7;
  ulong uVar8;
  pointer *__ptr;
  Enum EVar9;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> import;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  data_segment_field;
  Location loc;
  string name;
  ModuleFieldList export_fields;
  _Head_base<0UL,_wabt::Import_*,_false> local_138;
  DataSegmentModuleField *local_130;
  intrusive_list<wabt::Expr> *local_128;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_120;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_118;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_110;
  _Head_base<0UL,_wabt::Expr_*,_false> local_108;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_100;
  Location local_f8;
  Location local_d8;
  string local_b8;
  ModuleFieldList local_98;
  Var local_78;
  
  RVar7 = Expect(this,Lpar);
  if (RVar7.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_78,this);
  local_f8.field_1.field_1.offset = local_78.loc.field_1.field_1.offset;
  local_f8.field_1._8_8_ = local_78.loc.field_1._8_8_;
  local_f8.filename.data_ = local_78.loc.filename.data_;
  local_f8.filename.size_ = local_78.loc.filename.size_;
  RVar7 = Expect(this,Memory);
  if (RVar7.enum_ == Error) {
    return (Result)Error;
  }
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  ParseBindVarOpt(this,&local_b8);
  local_98.size_ = 0;
  local_98.first_ = (ModuleField *)0x0;
  local_98.last_ = (ModuleField *)0x0;
  RVar7 = ParseInlineExports(this,&local_98,Memory);
  EVar9 = Error;
  pMVar3 = local_98.first_;
  if (RVar7.enum_ == Error) goto joined_r0x00160565;
  bVar6 = PeekMatchLpar(this,Import);
  if (bVar6) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::MemoryImport,std::__cxx11::string&>((wabt *)&local_138,&local_b8);
    RVar7 = ParseInlineImport(this,local_138._M_head_impl);
    if (((RVar7.enum_ != Error) &&
        (RVar7 = ParseLimitsIndex(this,(Limits *)
                                       &(((Memory *)((long)local_138._M_head_impl + 0x40))->
                                        page_limits).has_max), RVar7.enum_ != Error)) &&
       (RVar7 = ParseLimits(this,(Limits *)
                                 &(((Memory *)((long)local_138._M_head_impl + 0x40))->page_limits).
                                  has_max), RVar7.enum_ != Error)) {
      GetToken((Token *)&local_78,this);
      local_d8.field_1.field_0.line = local_78.loc.field_1._0_4_;
      local_d8.field_1.field_0.first_column = local_78.loc.field_1._4_4_;
      local_d8.field_1.field_0.last_column = (int)local_78.loc.field_1._8_8_;
      local_d8.field_1._12_4_ = (undefined4)((ulong)local_78.loc.field_1._8_8_ >> 0x20);
      local_d8.filename.data_ = local_78.loc.filename.data_;
      local_d8.filename.size_._0_4_ = (undefined4)local_78.loc.filename.size_;
      local_d8.filename.size_._4_4_ = (undefined4)(local_78.loc.filename.size_ >> 0x20);
      local_100._M_head_impl = (ImportModuleField *)operator_new(0x48);
      _Var4._M_head_impl = local_138._M_head_impl;
      local_138._M_head_impl = (Import *)0x0;
      ((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
      .super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      ((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
      .super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      ((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
      ._vptr_ModuleField = (_func_int **)&PTR__ModuleField_001b01b0;
      ((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
      .loc.filename.data_ = local_d8.filename.data_;
      ((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
      .loc.filename.size_ =
           CONCAT44(local_d8.filename.size_._4_4_,(undefined4)local_d8.filename.size_);
      ((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
      .loc.field_1.field_1.offset =
           CONCAT44(local_d8.field_1.field_0.first_column,local_d8.field_1.field_0.line);
      *(ulong *)((long)&((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>)
                        .super_ModuleField.loc.field_1 + 8) =
           CONCAT44(local_d8.field_1._12_4_,local_d8.field_1.field_0.last_column);
      ((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
      .type_ = Import;
      ((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
      ._vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_001b0990;
      ((local_100._M_head_impl)->import)._M_t.
      super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
      super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var4._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_100);
      if (local_100._M_head_impl != (ImportModuleField *)0x0) {
        (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_100._M_head_impl = (ImportModuleField *)0x0;
      goto LAB_00160511;
    }
  }
  else {
    MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&local_138,&local_f8,&local_b8);
    RVar7 = ParseLimitsIndex(this,&((Memory *)((long)local_138._M_head_impl + 0x40))->page_limits);
    if (RVar7.enum_ != Error) {
      bVar6 = MatchLpar(this,Data);
      if (bVar6) {
        MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>((wabt *)&local_130,&local_f8);
        pDVar5 = local_130;
        local_d8.field_1.field_0.line = 0;
        local_d8.field_1.field_0.first_column = 0;
        local_d8.field_1.field_0.last_column = 0;
        local_d8.filename.data_ = (char *)0x0;
        local_d8.filename.size_._0_4_ = 0;
        local_d8.filename.size_._4_4_ = 0;
        Var::Var(&local_78,
                 (Index)((ulong)((long)(module->memories).
                                       super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->memories).
                                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_d8);
        Var::operator=(&(pDVar5->data_segment).memory_var,&local_78);
        Var::~Var(&local_78);
        local_128 = &(pDVar5->data_segment).offset;
        local_108._M_head_impl = (Expr *)operator_new(0x88);
        ((local_108._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        ((local_108._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        ((local_108._M_head_impl)->loc).filename.data_ = (char *)0x0;
        ((local_108._M_head_impl)->loc).filename.size_ = 0;
        *(undefined8 *)((long)&((local_108._M_head_impl)->loc).filename.size_ + 4) = 0;
        *(undefined8 *)((long)&((local_108._M_head_impl)->loc).field_1.field_1.offset + 4) = 0;
        (local_108._M_head_impl)->type_ = Const;
        (local_108._M_head_impl)->_vptr_Expr = (_func_int **)&PTR__Expr_001b0520;
        local_108._M_head_impl[1]._vptr_Expr = (_func_int **)0x0;
        local_108._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
        *(undefined8 *)
         ((long)&local_108._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ + 4) = 0;
        *(undefined8 *)
         ((long)&local_108._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.prev_ + 4) = 0;
        *(undefined4 *)&local_108._M_head_impl[1].loc.filename.size_ = 0xffffffff;
        local_108._M_head_impl[1].loc.field_1.field_0.line = 0;
        local_108._M_head_impl[1].type_ = AtomicLoad;
        intrusive_list<wabt::Expr>::push_back
                  (local_128,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_108)
        ;
        if (local_108._M_head_impl != (Expr *)0x0) {
          (*(local_108._M_head_impl)->_vptr_Expr[1])();
        }
        local_108._M_head_impl = (Expr *)0x0;
        if ((pDVar5->data_segment).offset.size_ == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                        ,0x192,
                        "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                       );
        }
        pEVar1 = (pDVar5->data_segment).offset.last_;
        (pEVar1->loc).field_1.field_1.offset = (size_t)local_f8.field_1.field_1.offset;
        *(undefined8 *)((long)&(pEVar1->loc).field_1 + 8) = local_f8.field_1._8_8_;
        (pEVar1->loc).filename.data_ = local_f8.filename.data_;
        (pEVar1->loc).filename.size_ = local_f8.filename.size_;
        ParseTextListOpt(this,&(pDVar5->data_segment).data);
        RVar7 = Expect(this,Rpar);
        if (RVar7.enum_ != Error) {
          uVar8 = (ulong)((*(int *)&(pDVar5->data_segment).data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(pDVar5->data_segment).data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 0xffffU >> 0x10);
          (((Memory *)((long)local_138._M_head_impl + 0x40))->page_limits).initial = uVar8;
          (((Memory *)((long)local_138._M_head_impl + 0x40))->page_limits).max = uVar8;
          (((Memory *)((long)local_138._M_head_impl + 0x40))->page_limits).has_max = true;
          local_110._M_head_impl = (MemoryModuleField *)local_138._M_head_impl;
          local_138._M_head_impl = (Import *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_110);
          if (local_110._M_head_impl != (MemoryModuleField *)0x0) {
            (*((local_110._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_110._M_head_impl = (MemoryModuleField *)0x0;
          local_118._M_head_impl = local_130;
          local_130 = (DataSegmentModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                      *)&local_118);
          if (local_118._M_head_impl != (DataSegmentModuleField *)0x0) {
            (*((local_118._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_118._M_head_impl = (DataSegmentModuleField *)0x0;
        }
        if (local_130 != (DataSegmentModuleField *)0x0) {
          (*(local_130->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
            _vptr_ModuleField[1])();
        }
        if (RVar7.enum_ != Error) {
LAB_00160511:
          if ((MemoryModuleField *)local_138._M_head_impl != (MemoryModuleField *)0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &(local_138._M_head_impl)->_vptr_Import)->super_ModuleField)._vptr_ModuleField[1])();
          }
          anon_unknown_1::AppendInlineExportFields
                    (module,&local_98,
                     (int)((ulong)((long)(module->memories).
                                         super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(module->memories).
                                        super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
          RVar7 = Expect(this,Rpar);
          EVar9 = (Enum)(RVar7.enum_ == Error);
          pMVar3 = local_98.first_;
          goto joined_r0x00160565;
        }
      }
      else {
        RVar7 = ParseLimits(this,&((Memory *)((long)local_138._M_head_impl + 0x40))->page_limits);
        if (RVar7.enum_ != Error) {
          local_120._M_head_impl = (MemoryModuleField *)local_138._M_head_impl;
          local_138._M_head_impl = (Import *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_120);
          if (local_120._M_head_impl != (MemoryModuleField *)0x0) {
            (*((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_120._M_head_impl = (MemoryModuleField *)0x0;
          goto LAB_00160511;
        }
      }
    }
  }
  pMVar3 = local_98.first_;
  if ((MemoryModuleField *)local_138._M_head_impl != (MemoryModuleField *)0x0) {
    (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)&(local_138._M_head_impl)->_vptr_Import)->
      super_ModuleField)._vptr_ModuleField[1])();
    pMVar3 = local_98.first_;
  }
joined_r0x00160565:
  while (pMVar3 != (ModuleField *)0x0) {
    pMVar2 = (pMVar3->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*pMVar3->_vptr_ModuleField[1])();
    pMVar3 = pMVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return (Result)EVar9;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimitsIndex(&field->memory.page_limits));
    if (MatchLpar(TokenType::Data)) {
      auto data_segment_field = MakeUnique<DataSegmentModuleField>(loc);
      DataSegment& data_segment = data_segment_field->data_segment;
      data_segment.memory_var = Var(module->memories.size());
      data_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
      data_segment.offset.back().loc = loc;
      ParseTextListOpt(&data_segment.data);
      EXPECT(Rpar);

      uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
      uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
      field->memory.page_limits.initial = page_size;
      field->memory.page_limits.max = page_size;
      field->memory.page_limits.has_max = true;

      module->AppendField(std::move(field));
      module->AppendField(std::move(data_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&field->memory.page_limits));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}